

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedLocationIdentifier.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::NamedLocationIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,NamedLocationIdentifier *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  NamedLocationIdentifier *local_18;
  NamedLocationIdentifier *this_local;
  
  local_18 = this;
  this_local = (NamedLocationIdentifier *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Named Location Identifier:");
  poVar1 = std::operator<<(poVar1,"\n\tName:   ");
  ENUMS::GetEnumAsStringStationName_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)this->m_ui16StnName,Value)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tNumber: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16StnNum);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString NamedLocationIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Named Location Identifier:"
       << "\n\tName:   " << GetEnumAsStringStationName( m_ui16StnName )
       << "\n\tNumber: " << m_ui16StnNum
       << "\n";

    return ss.str();
}